

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

bool Js::JavascriptNumber::IsInt32_NoChecks(Var number)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double value;
  
  if (number == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x94,"(number)","number");
    if (!bVar2) goto LAB_00b8a412;
    *puVar3 = 0;
  }
  else {
    if ((ulong)number >> 0x32 != 0) goto LAB_00b8a401;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                              ,0x95,"(Is(number))","Is(number)");
  if (!bVar2) {
LAB_00b8a412:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00b8a401:
  value = GetValue(number);
  bVar2 = IsInt32(value);
  return bVar2;
}

Assistant:

bool JavascriptNumber::IsInt32_NoChecks(const Var number)
    {
        Assert(number);
        Assert(Is(number));

        return IsInt32(GetValue(number));
    }